

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filteredbrk.cpp
# Opt level: O3

FilteredBreakIteratorBuilder *
icu_63::FilteredBreakIteratorBuilder::createInstance(Locale *where,UErrorCode *status)

{
  SimpleFilteredBreakIteratorBuilder *this;
  
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    this = (SimpleFilteredBreakIteratorBuilder *)
           UMemory::operator_new((UMemory *)0x30,(size_t)status);
    if (this == (SimpleFilteredBreakIteratorBuilder *)0x0) {
      if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
        *status = U_MEMORY_ALLOCATION_ERROR;
      }
    }
    else {
      SimpleFilteredBreakIteratorBuilder::SimpleFilteredBreakIteratorBuilder(this,where,status);
      if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
        return &this->super_FilteredBreakIteratorBuilder;
      }
      (*(this->super_FilteredBreakIteratorBuilder).super_UObject._vptr_UObject[1])(this);
    }
  }
  return (FilteredBreakIteratorBuilder *)0x0;
}

Assistant:

FilteredBreakIteratorBuilder *
FilteredBreakIteratorBuilder::createInstance(const Locale& where, UErrorCode& status) {
  if(U_FAILURE(status)) return NULL;
  LocalPointer<FilteredBreakIteratorBuilder> ret(new SimpleFilteredBreakIteratorBuilder(where, status), status);
  return (U_SUCCESS(status))? ret.orphan(): NULL;
}